

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O3

Value * duckdb::AllowedPathsSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  DBConfig *pDVar1;
  __node_base *p_Var2;
  vector<duckdb::Value,_true> allowed_paths;
  pointer local_68;
  pointer pVStack_60;
  pointer local_58;
  LogicalType local_50;
  vector<duckdb::Value,_true> local_38;
  
  pDVar1 = DBConfig::GetConfig(context);
  local_68 = (pointer)0x0;
  pVStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  p_Var2 = &(pDVar1->options).allowed_paths._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1));
  }
  LogicalType::LogicalType(&local_50,VARCHAR);
  local_38.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = local_68;
  local_38.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVStack_60;
  local_38.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_58;
  local_68 = (pointer)0x0;
  pVStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  Value::LIST(__return_storage_ptr__,&local_50,&local_38);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_38);
  LogicalType::~LogicalType(&local_50);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

Value AllowedPathsSetting::GetSetting(const ClientContext &context) {
	auto &config = DBConfig::GetConfig(context);
	vector<Value> allowed_paths;
	for (auto &dir : config.options.allowed_paths) {
		allowed_paths.emplace_back(dir);
	}
	return Value::LIST(LogicalType::VARCHAR, std::move(allowed_paths));
}